

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O3

void __thiscall booster::locale::util::gregorian_facet::~gregorian_facet(gregorian_facet *this)

{
  pointer pcVar1;
  
  *(undefined ***)&this->super_calendar_facet = &PTR__gregorian_facet_001d2578;
  pcVar1 = (this->terr_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->terr_).field_2) {
    operator_delete(pcVar1);
  }
  std::locale::facet::~facet((facet *)this);
  operator_delete(this);
  return;
}

Assistant:

gregorian_facet(std::string const &terr,size_t refs = 0) : 
            calendar_facet(refs),
            terr_(terr)
        {
        }